

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void SortByDimension(Rtree *pRtree,int *aIdx,int nIdx,int iDim,RtreeCell *aCell,int *aSpare)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint nIdx_00;
  uint nIdx_01;
  
  if (nIdx < 2) {
    return;
  }
  nIdx_01 = (uint)nIdx >> 1;
  nIdx_00 = nIdx - nIdx_01;
  SortByDimension(pRtree,aIdx,nIdx_01,iDim,aCell,aSpare);
  SortByDimension(pRtree,aIdx + nIdx_01,nIdx_00,iDim,aCell,aSpare);
  memcpy(aSpare,aIdx,(ulong)nIdx_01 * 4);
  uVar8 = 0;
  lVar10 = 0;
  do {
    lVar10 = (long)(int)lVar10;
    while( true ) {
      uVar9 = (uint)lVar10;
      if (((int)nIdx_01 <= (int)uVar9) && ((int)nIdx_00 <= (int)uVar8)) {
        return;
      }
      iVar3 = (aIdx + nIdx_01)[uVar8];
      if (pRtree->eCoordType == '\0') {
        uVar1 = *(undefined8 *)(aCell[aSpare[lVar10]].aCoord + iDim * 2);
        uVar2 = *(undefined8 *)(aCell[iVar3].aCoord + iDim * 2);
        fVar4 = (float)uVar2;
        fVar6 = (float)((ulong)uVar2 >> 0x20);
        fVar5 = (float)uVar1;
        fVar7 = (float)((ulong)uVar1 >> 0x20);
      }
      else {
        uVar1 = *(undefined8 *)(aCell[aSpare[lVar10]].aCoord + iDim * 2);
        fVar5 = (float)(int)uVar1;
        fVar7 = (float)(int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)(aCell[iVar3].aCoord + iDim * 2);
        fVar4 = (float)(int)uVar1;
        fVar6 = (float)(int)((ulong)uVar1 >> 0x20);
      }
      if ((nIdx_01 == uVar9) ||
         (((uVar8 != nIdx_00 && (fVar4 <= fVar5)) &&
          ((fVar5 != fVar4 || ((NAN(fVar5) || NAN(fVar4) || (fVar6 <= fVar7)))))))) break;
      aIdx[(int)(uVar8 + uVar9)] = aSpare[lVar10];
      lVar10 = lVar10 + 1;
    }
    aIdx[(int)(uVar8 + uVar9)] = iVar3;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static void SortByDimension(
  Rtree *pRtree,
  int *aIdx, 
  int nIdx, 
  int iDim, 
  RtreeCell *aCell, 
  int *aSpare
){
  if( nIdx>1 ){

    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDimension(pRtree, aLeft, nLeft, iDim, aCell, aSpare);
    SortByDimension(pRtree, aRight, nRight, iDim, aCell, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;
    while( iLeft<nLeft || iRight<nRight ){
      RtreeDValue xleft1 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2]);
      RtreeDValue xleft2 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2+1]);
      RtreeDValue xright1 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2]);
      RtreeDValue xright2 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2+1]);
      if( (iLeft!=nLeft) && ((iRight==nRight)
       || (xleft1<xright1)
       || (xleft1==xright1 && xleft2<xright2)
      )){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue xleft1 = aCell[aIdx[jj-1]].aCoord[iDim*2];
        RtreeDValue xleft2 = aCell[aIdx[jj-1]].aCoord[iDim*2+1];
        RtreeDValue xright1 = aCell[aIdx[jj]].aCoord[iDim*2];
        RtreeDValue xright2 = aCell[aIdx[jj]].aCoord[iDim*2+1];
        assert( xleft1<=xright1 && (xleft1<xright1 || xleft2<=xright2) );
      }
    }
#endif
  }
}